

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O0

Rect __thiscall lunasvg::SVGPolyElement::updateShape(SVGPolyElement *this,Path *path)

{
  float fVar1;
  bool bVar2;
  ElementID EVar3;
  PointList *this_00;
  const_reference pvVar4;
  size_type sVar5;
  int __fd;
  ulong uVar6;
  ulong local_38;
  size_t i;
  PointList *points;
  Path *path_local;
  SVGPolyElement *this_local;
  
  this_00 = SVGPointList::values(&this->m_points);
  bVar2 = std::vector<lunasvg::Point,_std::allocator<lunasvg::Point>_>::empty(this_00);
  if (bVar2) {
    _this_local = (Rect)ZEXT816(0);
  }
  else {
    pvVar4 = std::vector<lunasvg::Point,_std::allocator<lunasvg::Point>_>::operator[](this_00,0);
    fVar1 = pvVar4->x;
    uVar6 = 0;
    pvVar4 = std::vector<lunasvg::Point,_std::allocator<lunasvg::Point>_>::operator[](this_00,0);
    Path::moveTo(path,fVar1,pvVar4->y);
    local_38 = 1;
    while( true ) {
      __fd = (int)uVar6;
      sVar5 = std::vector<lunasvg::Point,_std::allocator<lunasvg::Point>_>::size(this_00);
      if (sVar5 <= local_38) break;
      pvVar4 = std::vector<lunasvg::Point,_std::allocator<lunasvg::Point>_>::operator[]
                         (this_00,local_38);
      fVar1 = pvVar4->x;
      uVar6 = local_38;
      pvVar4 = std::vector<lunasvg::Point,_std::allocator<lunasvg::Point>_>::operator[]
                         (this_00,local_38);
      Path::lineTo(path,fVar1,pvVar4->y);
      local_38 = local_38 + 1;
    }
    EVar3 = SVGElement::id((SVGElement *)this);
    if (EVar3 == Polygon) {
      Path::close(path,__fd);
    }
    _this_local = Path::boundingRect(path);
  }
  return _this_local;
}

Assistant:

Rect SVGPolyElement::updateShape(Path& path)
{
    const auto& points = m_points.values();
    if(points.empty()) {
        return Rect::Empty;
    }

    path.moveTo(points[0].x, points[0].y);
    for(size_t i = 1; i < points.size(); i++) {
        path.lineTo(points[i].x, points[i].y);
    }

    if(id() == ElementID::Polygon)
        path.close();
    return path.boundingRect();
}